

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O2

void __thiscall
BuildWithDepsLogTestDiscoveredDepDuringBuildChanged::Run
          (BuildWithDepsLogTestDiscoveredDepDuringBuildChanged *this)

{
  VirtualFileSystem *this_00;
  int *piVar1;
  BuildConfig *config;
  StatusPrinter *status;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  long lVar4;
  Test *pTVar5;
  unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_> uVar6;
  unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_> uVar7;
  bool bVar8;
  LoadStatus LVar9;
  Node *pNVar10;
  allocator<char> local_369;
  string local_368;
  string err;
  DepsLog deps_log;
  Builder builder;
  State state;
  BuildLog build_log;
  
  err._M_dataplus._M_p = (pointer)&err.field_2;
  err._M_string_length = 0;
  err.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&builder,"in1",(allocator<char> *)&build_log);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&state,"",(allocator<char> *)&deps_log);
  this_00 = &(this->super_BuildWithDepsLogTest).super_BuildTest.fs_;
  VirtualFileSystem::Create(this_00,(string *)&builder,(string *)&state);
  std::__cxx11::string::~string((string *)&state);
  std::__cxx11::string::~string((string *)&builder);
  piVar1 = &(this->super_BuildWithDepsLogTest).super_BuildTest.fs_.now_;
  *piVar1 = *piVar1 + 1;
  BuildLog::BuildLog(&build_log);
  State::State(&state);
  iVar3 = g_current_test->assertion_failures_;
  AssertParse(&state,
              "rule touch-out-implicit-dep\n  command = touch $out ; sleep 1 ; touch $test_dependency\nrule generate-depfile\n  command = touch $out ; echo \"$out: $test_dependency\" > $depfile\nbuild out1: touch-out-implicit-dep in1\n  test_dependency = inimp\nbuild out2: generate-depfile in1 || out1\n  test_dependency = inimp\n  depfile = out2.d\n  deps = gcc\n"
              ,(ManifestParserOptions)0x0);
  pTVar5 = g_current_test;
  if (iVar3 != g_current_test->assertion_failures_) {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    goto LAB_00135a16;
  }
  paVar2 = &deps_log.file_path_.field_2;
  deps_log.needs_recompaction_ = false;
  deps_log.file_ = (FILE *)0x0;
  deps_log.file_path_._M_string_length = 0;
  deps_log.file_path_.field_2._M_local_buf[0] = '\0';
  deps_log.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  deps_log.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  deps_log.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  deps_log.file_path_._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&builder,"ninja_deps",(allocator<char> *)&local_368);
  bVar8 = DepsLog::OpenForWrite(&deps_log,(string *)&builder,&err);
  bVar8 = testing::Test::Check
                    (pTVar5,bVar8,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                     ,0xa8f,"deps_log.OpenForWrite(\"ninja_deps\", &err)");
  std::__cxx11::string::~string((string *)&builder);
  pTVar5 = g_current_test;
  if (bVar8) {
    bVar8 = std::operator==("",&err);
    bVar8 = testing::Test::Check
                      (pTVar5,bVar8,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                       ,0xa90,"\"\" == err");
    if (!bVar8) goto LAB_00135a08;
    config = &(this->super_BuildWithDepsLogTest).super_BuildTest.config_;
    status = &(this->super_BuildWithDepsLogTest).super_BuildTest.status_;
    Builder::Builder(&builder,&state,config,&build_log,&deps_log,&this_00->super_DiskInterface,
                     &status->super_Status,0);
    uVar6._M_t.super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
    super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
    super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
         (__uniq_ptr_data<CommandRunner,_std::default_delete<CommandRunner>,_true,_true>)
         &(this->super_BuildWithDepsLogTest).super_BuildTest.command_runner_;
    uVar7._M_t.super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
    super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
    super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
         uVar6._M_t.super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
         super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
         super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
    if ((__uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>)
        builder.command_runner_._M_t.
        super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
        super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
        super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>)0x0) {
      lVar4 = *(long *)builder.command_runner_._M_t.
                       super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
                       super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
      builder.command_runner_._M_t.
      super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
      super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
      super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
           uVar6._M_t.super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t
           .super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
           super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
      (**(code **)(lVar4 + 8))();
      uVar7._M_t.super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
      super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
      super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
           builder.command_runner_._M_t.
           super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
           super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
           super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
    }
    builder.command_runner_._M_t.
    super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
    super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
    super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
         uVar7._M_t.super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
         super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
         super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
    pTVar5 = g_current_test;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_368,"out2",&local_369);
    pNVar10 = Builder::AddTarget(&builder,&local_368,&err);
    testing::Test::Check
              (pTVar5,pNVar10 != (Node *)0x0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0xa94,"builder.AddTarget(\"out2\", &err)");
    std::__cxx11::string::~string((string *)&local_368);
    pTVar5 = g_current_test;
    bVar8 = Builder::AlreadyUpToDate(&builder);
    testing::Test::Check
              (pTVar5,!bVar8,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0xa95,"builder.AlreadyUpToDate()");
    pTVar5 = g_current_test;
    bVar8 = Builder::Build(&builder,&err);
    testing::Test::Check
              (pTVar5,bVar8,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0xa97,"builder.Build(&err)");
    pTVar5 = g_current_test;
    bVar8 = Builder::AlreadyUpToDate(&builder);
    testing::Test::Check
              (pTVar5,bVar8,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0xa98,"builder.AlreadyUpToDate()");
    DepsLog::Close(&deps_log);
    builder.command_runner_._M_t.
    super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
    super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
    super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
         (__uniq_ptr_data<CommandRunner,_std::default_delete<CommandRunner>,_true,_true>)
         (__uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>)0x0;
    Builder::~Builder(&builder);
    DepsLog::~DepsLog(&deps_log);
    State::~State(&state);
    piVar1 = &(this->super_BuildWithDepsLogTest).super_BuildTest.fs_.now_;
    *piVar1 = *piVar1 + 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&builder,"in1",(allocator<char> *)&deps_log);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&state,"",(allocator<char> *)&local_368);
    VirtualFileSystem::Create(this_00,(string *)&builder,(string *)&state);
    std::__cxx11::string::~string((string *)&state);
    std::__cxx11::string::~string((string *)&builder);
    State::State(&state);
    iVar3 = g_current_test->assertion_failures_;
    AssertParse(&state,
                "rule touch-out-implicit-dep\n  command = touch $out ; sleep 1 ; touch $test_dependency\nrule generate-depfile\n  command = touch $out ; echo \"$out: $test_dependency\" > $depfile\nbuild out1: touch-out-implicit-dep in1\n  test_dependency = inimp\nbuild out2: generate-depfile in1 || out1\n  test_dependency = inimp\n  depfile = out2.d\n  deps = gcc\n"
                ,(ManifestParserOptions)0x0);
    pTVar5 = g_current_test;
    if (iVar3 != g_current_test->assertion_failures_) {
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
      goto LAB_00135a16;
    }
    deps_log.needs_recompaction_ = false;
    deps_log.file_ = (FILE *)0x0;
    deps_log.file_path_._M_string_length = 0;
    deps_log.file_path_.field_2._M_local_buf[0] = '\0';
    deps_log.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    deps_log.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    deps_log.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    deps_log.file_path_._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&builder,"ninja_deps",(allocator<char> *)&local_368);
    LVar9 = DepsLog::Load(&deps_log,(string *)&builder,&state,&err);
    bVar8 = testing::Test::Check
                      (pTVar5,LVar9 != LOAD_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                       ,0xaa6,"deps_log.Load(\"ninja_deps\", &state, &err)");
    std::__cxx11::string::~string((string *)&builder);
    pTVar5 = g_current_test;
    if (bVar8) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&builder,"ninja_deps",(allocator<char> *)&local_368);
      bVar8 = DepsLog::OpenForWrite(&deps_log,(string *)&builder,&err);
      bVar8 = testing::Test::Check
                        (pTVar5,bVar8,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                         ,0xaa7,"deps_log.OpenForWrite(\"ninja_deps\", &err)");
      std::__cxx11::string::~string((string *)&builder);
      pTVar5 = g_current_test;
      if (bVar8) {
        bVar8 = std::operator==("",&err);
        bVar8 = testing::Test::Check
                          (pTVar5,bVar8,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                           ,0xaa8,"\"\" == err");
        if (bVar8) {
          Builder::Builder(&builder,&state,config,&build_log,&deps_log,&this_00->super_DiskInterface
                           ,&status->super_Status,0);
          uVar7._M_t.super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
          super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
          super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
               uVar6._M_t.super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>.
               _M_t.super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
               super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
          if ((__uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>)
              builder.command_runner_._M_t.
              super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
              super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
              super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl !=
              (__uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>)0x0) {
            lVar4 = *(long *)builder.command_runner_._M_t.
                             super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>
                             .super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
            builder.command_runner_._M_t.
            super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
            super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
            super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
                 uVar6._M_t.
                 super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
                 super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
                 super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
            (**(code **)(lVar4 + 8))();
            uVar7._M_t.super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>.
            _M_t.super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
            super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
                 builder.command_runner_._M_t.
                 super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
                 super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
                 super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
          }
          builder.command_runner_._M_t.
          super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
          super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
          super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
               uVar7._M_t.super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>.
               _M_t.super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
               super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
          pTVar5 = g_current_test;
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_368,"out2",&local_369)
          ;
          pNVar10 = Builder::AddTarget(&builder,&local_368,&err);
          testing::Test::Check
                    (pTVar5,pNVar10 != (Node *)0x0,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                     ,0xaac,"builder.AddTarget(\"out2\", &err)");
          std::__cxx11::string::~string((string *)&local_368);
          pTVar5 = g_current_test;
          bVar8 = Builder::AlreadyUpToDate(&builder);
          testing::Test::Check
                    (pTVar5,!bVar8,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                     ,0xaad,"builder.AlreadyUpToDate()");
          pTVar5 = g_current_test;
          bVar8 = Builder::Build(&builder,&err);
          testing::Test::Check
                    (pTVar5,bVar8,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                     ,0xaaf,"builder.Build(&err)");
          pTVar5 = g_current_test;
          bVar8 = Builder::AlreadyUpToDate(&builder);
          testing::Test::Check
                    (pTVar5,bVar8,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                     ,0xab0,"builder.AlreadyUpToDate()");
          DepsLog::Close(&deps_log);
          builder.command_runner_._M_t.
          super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
          super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
          super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
               (__uniq_ptr_data<CommandRunner,_std::default_delete<CommandRunner>,_true,_true>)
               (__uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>)0x0;
          Builder::~Builder(&builder);
          DepsLog::~DepsLog(&deps_log);
          State::~State(&state);
          piVar1 = &(this->super_BuildWithDepsLogTest).super_BuildTest.fs_.now_;
          *piVar1 = *piVar1 + 1;
          State::State(&state);
          iVar3 = g_current_test->assertion_failures_;
          AssertParse(&state,
                      "rule touch-out-implicit-dep\n  command = touch $out ; sleep 1 ; touch $test_dependency\nrule generate-depfile\n  command = touch $out ; echo \"$out: $test_dependency\" > $depfile\nbuild out1: touch-out-implicit-dep in1\n  test_dependency = inimp\nbuild out2: generate-depfile in1 || out1\n  test_dependency = inimp\n  depfile = out2.d\n  deps = gcc\n"
                      ,(ManifestParserOptions)0x0);
          pTVar5 = g_current_test;
          if (iVar3 != g_current_test->assertion_failures_) {
            g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
            goto LAB_00135a16;
          }
          deps_log.needs_recompaction_ = false;
          deps_log.file_ = (FILE *)0x0;
          deps_log.file_path_._M_string_length = 0;
          deps_log.file_path_.field_2._M_local_buf[0] = '\0';
          deps_log.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          deps_log.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          deps_log.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          deps_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          deps_log.file_path_._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&builder,"ninja_deps",(allocator<char> *)&local_368);
          LVar9 = DepsLog::Load(&deps_log,(string *)&builder,&state,&err);
          bVar8 = testing::Test::Check
                            (pTVar5,LVar9 != LOAD_ERROR,
                             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                             ,0xabd,"deps_log.Load(\"ninja_deps\", &state, &err)");
          std::__cxx11::string::~string((string *)&builder);
          pTVar5 = g_current_test;
          if (bVar8) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&builder,"ninja_deps",(allocator<char> *)&local_368);
            bVar8 = DepsLog::OpenForWrite(&deps_log,(string *)&builder,&err);
            bVar8 = testing::Test::Check
                              (pTVar5,bVar8,
                               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                               ,0xabe,"deps_log.OpenForWrite(\"ninja_deps\", &err)");
            std::__cxx11::string::~string((string *)&builder);
            pTVar5 = g_current_test;
            if (!bVar8) goto LAB_00135a68;
            bVar8 = std::operator==("",&err);
            bVar8 = testing::Test::Check
                              (pTVar5,bVar8,
                               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                               ,0xabf,"\"\" == err");
            if (bVar8) {
              Builder::Builder(&builder,&state,config,&build_log,&deps_log,
                               &this_00->super_DiskInterface,&status->super_Status,0);
              if ((__uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>)
                  builder.command_runner_._M_t.
                  super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
                  super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
                  super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl !=
                  (__uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>)0x0) {
                lVar4 = *(long *)builder.command_runner_._M_t.
                                 super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>
                                 .super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
                builder.command_runner_._M_t.
                super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
                super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
                super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
                     uVar6._M_t.
                     super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
                     super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
                     super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
                (**(code **)(lVar4 + 8))();
                uVar6._M_t.super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>
                ._M_t.super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
                super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
                     builder.command_runner_._M_t.
                     super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
                     super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
                     super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
              }
              builder.command_runner_._M_t.
              super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
              super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
              super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
                   uVar6._M_t.
                   super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
                   super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
                   super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
              pTVar5 = g_current_test;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_368,"out2",&local_369);
              pNVar10 = Builder::AddTarget(&builder,&local_368,&err);
              testing::Test::Check
                        (pTVar5,pNVar10 != (Node *)0x0,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                         ,0xac3,"builder.AddTarget(\"out2\", &err)");
              std::__cxx11::string::~string((string *)&local_368);
              pTVar5 = g_current_test;
              bVar8 = Builder::AlreadyUpToDate(&builder);
              testing::Test::Check
                        (pTVar5,bVar8,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                         ,0xac4,"builder.AlreadyUpToDate()");
              DepsLog::Close(&deps_log);
              builder.command_runner_._M_t.
              super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
              super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
              super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
                   (__uniq_ptr_data<CommandRunner,_std::default_delete<CommandRunner>,_true,_true>)
                   (__uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>)0x0;
              Builder::~Builder(&builder);
            }
            else {
              g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
            }
          }
          else {
LAB_00135a68:
            g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
          }
          DepsLog::~DepsLog(&deps_log);
          goto LAB_00135a16;
        }
      }
    }
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  else {
LAB_00135a08:
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  DepsLog::~DepsLog(&deps_log);
LAB_00135a16:
  State::~State(&state);
  BuildLog::~BuildLog(&build_log);
  std::__cxx11::string::~string((string *)&err);
  return;
}

Assistant:

TEST_F(BuildWithDepsLogTest, DiscoveredDepDuringBuildChanged) {
  string err;
  const char* manifest =
    "rule touch-out-implicit-dep\n"
    "  command = touch $out ; sleep 1 ; touch $test_dependency\n"
    "rule generate-depfile\n"
    "  command = touch $out ; echo \"$out: $test_dependency\" > $depfile\n"
    "build out1: touch-out-implicit-dep in1\n"
    "  test_dependency = inimp\n"
    "build out2: generate-depfile in1 || out1\n"
    "  test_dependency = inimp\n"
    "  depfile = out2.d\n"
    "  deps = gcc\n";

  fs_.Create("in1", "");
  fs_.Tick();

  BuildLog build_log;

  {
    State state;
    ASSERT_NO_FATAL_FAILURE(AssertParse(&state, manifest));

    DepsLog deps_log;
    ASSERT_TRUE(deps_log.OpenForWrite("ninja_deps", &err));
    ASSERT_EQ("", err);

    Builder builder(&state, config_, &build_log, &deps_log, &fs_, &status_, 0);
    builder.command_runner_.reset(&command_runner_);
    EXPECT_TRUE(builder.AddTarget("out2", &err));
    EXPECT_FALSE(builder.AlreadyUpToDate());

    EXPECT_TRUE(builder.Build(&err));
    EXPECT_TRUE(builder.AlreadyUpToDate());

    deps_log.Close();
    builder.command_runner_.release();
  }

  fs_.Tick();
  fs_.Create("in1", "");

  {
    State state;
    ASSERT_NO_FATAL_FAILURE(AssertParse(&state, manifest));

    DepsLog deps_log;
    ASSERT_TRUE(deps_log.Load("ninja_deps", &state, &err));
    ASSERT_TRUE(deps_log.OpenForWrite("ninja_deps", &err));
    ASSERT_EQ("", err);

    Builder builder(&state, config_, &build_log, &deps_log, &fs_, &status_, 0);
    builder.command_runner_.reset(&command_runner_);
    EXPECT_TRUE(builder.AddTarget("out2", &err));
    EXPECT_FALSE(builder.AlreadyUpToDate());

    EXPECT_TRUE(builder.Build(&err));
    EXPECT_TRUE(builder.AlreadyUpToDate());

    deps_log.Close();
    builder.command_runner_.release();
  }

  fs_.Tick();

  {
    State state;
    ASSERT_NO_FATAL_FAILURE(AssertParse(&state, manifest));

    DepsLog deps_log;
    ASSERT_TRUE(deps_log.Load("ninja_deps", &state, &err));
    ASSERT_TRUE(deps_log.OpenForWrite("ninja_deps", &err));
    ASSERT_EQ("", err);

    Builder builder(&state, config_, &build_log, &deps_log, &fs_, &status_, 0);
    builder.command_runner_.reset(&command_runner_);
    EXPECT_TRUE(builder.AddTarget("out2", &err));
    EXPECT_TRUE(builder.AlreadyUpToDate());

    deps_log.Close();
    builder.command_runner_.release();
  }
}